

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QSet<QTabBar_*> __thiscall QDockAreaLayoutInfo::usedTabBars(QDockAreaLayoutInfo *this)

{
  long lVar1;
  QList<QDockAreaLayoutItem> *this_00;
  qsizetype qVar2;
  const_reference pQVar3;
  QSet<QTabBar_*> *in_RSI;
  Hash in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutItem *item;
  int i;
  QSet<QTabBar_*> *result;
  QSet<QTabBar_*> *in_stack_ffffffffffffff98;
  int iVar4;
  uint3 in_stack_ffffffffffffffcc;
  uint uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (uint)in_stack_ffffffffffffffcc;
  *(undefined1 **)in_RDI.d = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QTabBar_*>::QSet((QSet<QTabBar_*> *)0x5765db);
  if (((ulong)in_RSI[0xb].q_hash.d & 1) != 0) {
    updateTabBar(_i);
    QSet<QTabBar_*>::insert(in_RSI,(QTabBar **)in_RDI.d);
  }
  iVar4 = 0;
  while( true ) {
    this_00 = (QList<QDockAreaLayoutItem> *)(long)iVar4;
    qVar2 = QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)(in_RSI + 8));
    if (qVar2 <= (long)this_00) break;
    pQVar3 = QList<QDockAreaLayoutItem>::at(this_00,(qsizetype)in_stack_ffffffffffffff98);
    if (pQVar3->subinfo != (QDockAreaLayoutInfo *)0x0) {
      usedTabBars((QDockAreaLayoutInfo *)CONCAT44(uVar5,iVar4));
      QSet<QTabBar_*>::operator+=((QSet<QTabBar_*> *)this_00,in_stack_ffffffffffffff98);
      QSet<QTabBar_*>::~QSet((QSet<QTabBar_*> *)0x576694);
    }
    iVar4 = iVar4 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QSet<QTabBar_*>)(Hash)in_RDI.d;
}

Assistant:

QSet<QTabBar*> QDockAreaLayoutInfo::usedTabBars() const
{
    QSet<QTabBar*> result;

    if (tabbed) {
        updateTabBar();
        result.insert(tabBar);
    }

    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.subinfo != nullptr)
            result += item.subinfo->usedTabBars();
    }

    return result;
}